

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * QLocale::territoryToCode(QString *__return_storage_ptr__,Territory territory)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  qsizetype qVar5;
  uint uVar6;
  uchar *puVar7;
  uchar *puVar8;
  QString *this;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = territory - 0x106 & 0xffff;
  puVar7 = (uchar *)(ulong)uVar6;
  this = (QString *)0x0;
  puVar8 = (uchar *)0x0;
  if (0xfefa < uVar6) {
    puVar7 = "ZZ";
    puVar8 = "ZZ" + (ulong)territory * 3;
    this = (QString *)(3 - (ulong)("ZZ"[(ulong)territory * 3 + 2] == '\0'));
  }
  if (puVar8 == (uchar *)0x0) {
    this = (QString *)0x0;
  }
  ba.m_data = (storage_type *)puVar7;
  ba.m_size = (qsizetype)puVar8;
  QString::fromLatin1(&local_38,this,ba);
  qVar5 = local_38.d.size;
  uVar1 = local_38.d.d._0_4_;
  uVar2 = local_38.d.d._4_4_;
  uVar3 = local_38.d.ptr._0_4_;
  uVar4 = local_38.d.ptr._4_4_;
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char16_t *)0x0;
  *(undefined4 *)&(__return_storage_ptr__->d).d = uVar1;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar2;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = uVar3;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uVar4;
  local_38.d.size = 0;
  (__return_storage_ptr__->d).size = qVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::territoryToCode(QLocale::Territory territory)
{
    return QLocalePrivate::territoryToCode(territory);
}